

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  allocator<char> local_262;
  allocator<char> local_261;
  string local_260 [32];
  string shader_source;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string((string *)&shader_source,(string *)shader_start_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"    float",&local_261);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"[2]",&local_262);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_260,this,local_40,local_60,2);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_80," a",&local_261);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"[2]",&local_262);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_260,this,local_80,local_a0,0);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"b",&local_261);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"[2]",&local_262);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_260,this,local_c0,local_e0,1);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"c",&local_261);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"[2]",&local_262);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_260,this,local_100,local_120,2);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"d",&local_261);
  std::__cxx11::string::string<std::allocator<char>>(local_160,"[2]",&local_262);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_260,this,local_140,local_160,3);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>(local_180,"e",&local_261);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"[2]",&local_262);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_260,this,local_180,local_1a0,4);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"f",&local_261);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"[2]",&local_262);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_260,this,local_1c0,local_1e0,5);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"g",&local_261);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"[2]",&local_262);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_260,this,local_200,local_220,6);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::append((char *)&shader_source);
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b76795_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    goto switchD_00b76795_caseD_0;
  case 3:
    break;
  case 4:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x5fe);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((string *)&shader_source);
switchD_00b76795_caseD_0:
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_01721dd0 + *(int *)(&DAT_01721dd0 + (ulong)tested_shader_type * 4)))();
  return;
}

Assistant:

void SizedDeclarationsTypenameStyle2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source = shader_start;

	shader_source += this->extend_string("    float", "[2]", 2);
	shader_source += this->extend_string(" a", "[2]", 0);
	shader_source += ", ";
	shader_source += this->extend_string("b", "[2]", 1);
	shader_source += ", ";
	shader_source += this->extend_string("c", "[2]", 2);
	shader_source += ", ";
	shader_source += this->extend_string("d", "[2]", 3);
	shader_source += ", ";
	shader_source += this->extend_string("e", "[2]", 4);
	shader_source += ", ";
	shader_source += this->extend_string("f", "[2]", 5);
	shader_source += ", ";
	shader_source += this->extend_string("g", "[2]", 6);
	shader_source += ";\n";

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
}